

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O2

offset_in_TranslateToFuzzReader_to_subr __thiscall
_wasm__TranslateToFuzzReader___constwasm__Random__pick<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_wasm__Random__FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>___
          (void *this,
          FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)> *picker)

{
  value_type vVar1;
  value_type *pvVar2;
  _Vector_base<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type),_std::allocator<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_>
  local_30;
  
  wasm::Random::items<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>
            ((vector<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type),_std::allocator<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_>
              *)&local_30,(Random *)this,picker);
  pvVar2 = wasm::Random::
           pick<std::vector<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type),std::allocator<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>>>
                     ((Random *)this,
                      (vector<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type),_std::allocator<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_>
                       *)&local_30);
  vVar1 = *pvVar2;
  std::
  _Vector_base<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type),_std::allocator<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_>
  ::~_Vector_base(&local_30);
  return vVar1;
}

Assistant:

const T pick(FeatureOptions<T>& picker) {
    return pick(items(picker));
  }